

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  int iVar1;
  string *psVar2;
  undefined4 extraout_var;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string dir;
  long *local_1a8;
  undefined8 local_1a0;
  long local_198 [2];
  string local_188;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 *local_158;
  undefined1 local_150 [32];
  undefined8 local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  long *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  (*(gt->LocalGenerator->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])
            (&local_1a8,gt->LocalGenerator,gt);
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x17])(this);
  local_c0.first._M_str = (psVar2->_M_dataplus)._M_p;
  local_c0.first._M_len = psVar2->_M_string_length;
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8 = local_e0;
  local_f8 = 0;
  local_f0 = 1;
  local_e0[0] = 0x2f;
  local_a8 = 1;
  local_98 = 0;
  local_90 = local_1a0;
  local_88 = local_1a8;
  local_120 = local_118;
  local_130 = 0;
  local_128 = 1;
  local_118[0] = 0x2f;
  local_78 = 1;
  local_68 = 0;
  local_a0 = local_e8;
  local_80 = (undefined1 *)&local_1a8;
  local_70 = local_120;
  local_60 = strlen((char *)CONCAT44(extraout_var,iVar1));
  local_50 = 0;
  local_158 = local_150;
  local_168 = 0;
  local_160 = 1;
  local_150[0] = 0x2f;
  local_48 = 1;
  local_38 = 0;
  views._M_len = 6;
  views._M_array = &local_c0;
  local_58 = (char *)CONCAT44(extraout_var,iVar1);
  local_40 = local_158;
  cmCatViews(&local_188,views);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                             '/', gt->LocalGenerator->GetTargetDirectory(gt),
                             '/', this->GetCMakeCFGIntDir(), '/');
  gt->ObjectDirectory = dir;
}